

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeTriggerProgram(Parse *pParse,TriggerStep *pStepList,int orconf)

{
  char cVar1;
  byte bVar2;
  Vdbe *p;
  char *zP4;
  SrcList *pSVar3;
  ExprList *pChanges;
  Expr *pEVar4;
  IdList *pColumn;
  Upsert *pUpsert;
  Select *pSVar5;
  u8 local_6c;
  Select *pSelect;
  SelectDest sDest;
  sqlite3 *db;
  Vdbe *v;
  TriggerStep *pStep;
  int orconf_local;
  TriggerStep *pStepList_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  sDest.pOrderBy = (ExprList *)pParse->db;
  for (v = (Vdbe *)pStepList; v != (Vdbe *)0x0; v = (Vdbe *)v->nFkConstraint) {
    if (orconf == 0xb) {
      local_6c = *(u8 *)((long)&v->db + 1);
    }
    else {
      local_6c = (u8)orconf;
    }
    pParse->eOrconf = local_6c;
    if (v->iCurrentTime != 0) {
      zP4 = sqlite3MPrintf((sqlite3 *)sDest.pOrderBy,"-- %s",v->iCurrentTime);
      sqlite3VdbeAddOp4(p,0xb5,0x7fffffff,1,0,zP4,-6);
    }
    cVar1 = *(char *)&v->db;
    if (cVar1 == '\x7f') {
      pSVar3 = sqlite3TriggerStepSrc(pParse,(TriggerStep *)v);
      pSVar5 = sqlite3SelectDup((sqlite3 *)sDest.pOrderBy,(Select *)v->pNext,0);
      pColumn = sqlite3IdListDup((sqlite3 *)sDest.pOrderBy,(IdList *)v->nChange);
      bVar2 = pParse->eOrconf;
      pUpsert = sqlite3UpsertDup((sqlite3 *)sDest.pOrderBy,*(Upsert **)&v->iStatement);
      sqlite3Insert(pParse,pSVar3,pSVar5,pColumn,(uint)bVar2,pUpsert);
      sqlite3VdbeAddOp0(p,0x83);
    }
    else if (cVar1 == -0x80) {
      pSVar3 = sqlite3TriggerStepSrc(pParse,(TriggerStep *)v);
      pEVar4 = sqlite3ExprDup((sqlite3 *)sDest.pOrderBy,*(Expr **)&v->nCursor,0);
      sqlite3DeleteFrom(pParse,pSVar3,pEVar4,(ExprList *)0x0,(Expr *)0x0);
      sqlite3VdbeAddOp0(p,0x83);
    }
    else if (cVar1 == -0x7f) {
      pSVar3 = sqlite3TriggerStepSrc(pParse,(TriggerStep *)v);
      pChanges = sqlite3ExprListDup((sqlite3 *)sDest.pOrderBy,*(ExprList **)&v->pc,0);
      pEVar4 = sqlite3ExprDup((sqlite3 *)sDest.pOrderBy,*(Expr **)&v->nCursor,0);
      sqlite3Update(pParse,pSVar3,pChanges,pEVar4,(uint)pParse->eOrconf,(ExprList *)0x0,(Expr *)0x0,
                    (Upsert *)0x0);
      sqlite3VdbeAddOp0(p,0x83);
    }
    else {
      pSVar5 = sqlite3SelectDup((sqlite3 *)sDest.pOrderBy,(Select *)v->pNext,0);
      sqlite3SelectDestInit((SelectDest *)&pSelect,4,0);
      sqlite3Select(pParse,pSVar5,(SelectDest *)&pSelect);
      sqlite3SelectDelete((sqlite3 *)sDest.pOrderBy,pSVar5);
    }
  }
  return 0;
}

Assistant:

static int codeTriggerProgram(
  Parse *pParse,            /* The parser context */
  TriggerStep *pStepList,   /* List of statements inside the trigger body */
  int orconf                /* Conflict algorithm. (OE_Abort, etc) */
){
  TriggerStep *pStep;
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;

  assert( pParse->pTriggerTab && pParse->pToplevel );
  assert( pStepList );
  assert( v!=0 );
  for(pStep=pStepList; pStep; pStep=pStep->pNext){
    /* Figure out the ON CONFLICT policy that will be used for this step
    ** of the trigger program. If the statement that caused this trigger
    ** to fire had an explicit ON CONFLICT, then use it. Otherwise, use
    ** the ON CONFLICT policy that was specified as part of the trigger
    ** step statement. Example:
    **
    **   CREATE TRIGGER AFTER INSERT ON t1 BEGIN;
    **     INSERT OR REPLACE INTO t2 VALUES(new.a, new.b);
    **   END;
    **
    **   INSERT INTO t1 ... ;            -- insert into t2 uses REPLACE policy
    **   INSERT OR IGNORE INTO t1 ... ;  -- insert into t2 uses IGNORE policy
    */
    pParse->eOrconf = (orconf==OE_Default)?pStep->orconf:(u8)orconf;
    assert( pParse->okConstFactor==0 );

#ifndef SQLITE_OMIT_TRACE
    if( pStep->zSpan ){
      sqlite3VdbeAddOp4(v, OP_Trace, 0x7fffffff, 1, 0,
                        sqlite3MPrintf(db, "-- %s", pStep->zSpan),
                        P4_DYNAMIC);
    }
#endif

    switch( pStep->op ){
      case TK_UPDATE: {
        sqlite3Update(pParse,
          sqlite3TriggerStepSrc(pParse, pStep),
          sqlite3ExprListDup(db, pStep->pExprList, 0),
          sqlite3ExprDup(db, pStep->pWhere, 0),
          pParse->eOrconf, 0, 0, 0
        );
        sqlite3VdbeAddOp0(v, OP_ResetCount);
        break;
      }
      case TK_INSERT: {
        sqlite3Insert(pParse,
          sqlite3TriggerStepSrc(pParse, pStep),
          sqlite3SelectDup(db, pStep->pSelect, 0),
          sqlite3IdListDup(db, pStep->pIdList),
          pParse->eOrconf,
          sqlite3UpsertDup(db, pStep->pUpsert)
        );
        sqlite3VdbeAddOp0(v, OP_ResetCount);
        break;
      }
      case TK_DELETE: {
        sqlite3DeleteFrom(pParse,
          sqlite3TriggerStepSrc(pParse, pStep),
          sqlite3ExprDup(db, pStep->pWhere, 0), 0, 0
        );
        sqlite3VdbeAddOp0(v, OP_ResetCount);
        break;
      }
      default: assert( pStep->op==TK_SELECT ); {
        SelectDest sDest;
        Select *pSelect = sqlite3SelectDup(db, pStep->pSelect, 0);
        sqlite3SelectDestInit(&sDest, SRT_Discard, 0);
        sqlite3Select(pParse, pSelect, &sDest);
        sqlite3SelectDelete(db, pSelect);
        break;
      }
    }
  }

  return 0;
}